

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcPrsMem::~CTcPrsMem(CTcPrsMem *this)

{
  delete_all(this);
  return;
}

Assistant:

CTcPrsMem::~CTcPrsMem()
{
    /* delete all objects in our pool */
    delete_all();
}